

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeForJS.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeForJSPass::rewritePopcntEqualOne(OptimizeForJSPass *this,Expression *expr)

{
  UnaryOp UVar1;
  BinaryOp BVar2;
  BinaryOp BVar3;
  Type type;
  undefined4 uVar4;
  Unary *pUVar5;
  Unary *this_00;
  Expression *pEVar6;
  Expression *pEVar7;
  Const *pCVar8;
  Binary *pBVar9;
  Binary *this_01;
  undefined1 local_88 [8];
  Localizer temp;
  Builder local_38;
  Builder builder;
  
  type.id = (expr->type).id;
  if (type.id < 7) {
    UVar1 = *(UnaryOp *)(&DAT_00b910ec + type.id * 4);
    Localizer::Localizer
              ((Localizer *)local_88,expr,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .currFunction,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               .currModule);
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
         ).super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
         super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>.
         currModule;
    pUVar5 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (pUVar5->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar5->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar5->op = UVar1;
    pUVar5->value = (Expression *)temp._0_8_;
    Unary::finalize(pUVar5);
    this_00 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    this_00->op = EqZInt32;
    this_00->value = (Expression *)pUVar5;
    Unary::finalize(this_00);
    uVar4 = local_88._0_4_;
    BVar2 = *(BinaryOp *)(&DAT_00b91124 + type.id * 4);
    pEVar6 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar6->_id = LocalGetId;
    pEVar6[1]._id = uVar4;
    (pEVar6->type).id = type.id;
    BVar3 = *(BinaryOp *)(&DAT_00b91108 + type.id * 4);
    pEVar7 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
    pEVar7->_id = LocalGetId;
    pEVar7[1]._id = local_88._0_4_;
    (pEVar7->type).id = type.id;
    Literal::makeOne((Literal *)&temp.expr,type);
    pCVar8 = Builder::makeConst(&local_38,(Literal *)&temp.expr);
    pBVar9 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar9->op = BVar3;
    pBVar9->left = pEVar7;
    pBVar9->right = (Expression *)pCVar8;
    Binary::finalize(pBVar9);
    this_01 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    this_01->op = BVar2;
    this_01->left = pEVar6;
    this_01->right = (Expression *)pBVar9;
    Binary::finalize(this_01);
    pUVar5 = (Unary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
    (pUVar5->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
    (pUVar5->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
    pUVar5->op = UVar1;
    pUVar5->value = (Expression *)this_01;
    Unary::finalize(pUVar5);
    pBVar9 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
    (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
    pBVar9->op = AndInt32;
    pBVar9->left = (Expression *)this_00;
    pBVar9->right = (Expression *)pUVar5;
    Binary::finalize(pBVar9);
    Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>_>
                ).
                super_PostWalker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
                .
                super_Walker<wasm::OptimizeForJSPass,_wasm::Visitor<wasm::OptimizeForJSPass,_void>_>
               ,(Expression *)pBVar9);
    Literal::~Literal((Literal *)&temp.expr);
    return;
  }
  __assert_fail("isBasic() && \"Basic type expected\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                ,0xc6,"BasicType wasm::Type::getBasic() const");
}

Assistant:

void rewritePopcntEqualOne(Expression* expr) {
    // popcnt(x) == 1   ==>   !!x & !(x & (x - 1))
    using namespace Abstract;

    Type type = expr->type;

    UnaryOp eqzOp = getUnary(type, EqZ);
    Localizer temp(expr, getFunction(), getModule());
    Builder builder(*getModule());

    replaceCurrent(builder.makeBinary(
      AndInt32,
      builder.makeUnary(EqZInt32, builder.makeUnary(eqzOp, temp.expr)),
      builder.makeUnary(
        eqzOp,
        builder.makeBinary(
          getBinary(type, And),
          builder.makeLocalGet(temp.index, type),
          builder.makeBinary(
            getBinary(type, Sub),
            builder.makeLocalGet(temp.index, type),
            builder.makeConst(Literal::makeOne(type.getBasic())))))));
  }